

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O3

void __thiscall
TPZTransfer<long_double>::TransferResidual
          (TPZTransfer<long_double> *this,TPZFMatrix<long_double> *fine,
          TPZFMatrix<long_double> *coarse)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  longdouble in_ST0;
  longdouble lVar21;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  TPZFMatrix<long_double> tempcoarse;
  TPZFMatrix<long_double> local_150;
  TPZFMatrix<long_double> local_c0;
  
  uVar14 = (fine->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  uVar1 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  uVar2 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  iVar10 = (int)(coarse->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  iVar12 = (int)uVar14;
  iVar20 = (int)uVar2;
  if (iVar10 == iVar12) {
    iVar16 = *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c;
    if ((long)(int)(coarse->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow ==
        (long)iVar16 * uVar2) goto LAB_00ba01e8;
  }
  else {
    iVar16 = *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c;
  }
  (*(coarse->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xe])(coarse,(long)(iVar16 * iVar20),(long)iVar12,(ulong)(uint)(iVar16 * iVar20));
  iVar16 = *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c;
  iVar10 = iVar12;
LAB_00ba01e8:
  if (iVar16 == 1) {
    MultiplyScalar(this,fine,coarse,1);
    return;
  }
  if (0 < *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c) {
    iVar16 = (int)uVar1;
    uVar13 = (long)iVar10 * (long)iVar16;
    uVar17 = (long)iVar20 * (long)iVar12;
    uVar14 = uVar14 & 0x7fffffff;
    iVar18 = 0;
    do {
      local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_c0.fSize = 0;
      local_c0.fElem = (longdouble *)0x0;
      local_c0.fGiven = (longdouble *)0x0;
      local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0181e1d8;
      local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = (long)iVar16;
      local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = (long)iVar10;
      TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
      local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
      local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
      local_c0.fWork.fNAlloc = 0;
      local_c0.fWork.fStore = (longdouble *)0x0;
      local_c0.fWork.fNElements = 0;
      if (uVar13 != 0) {
        local_c0.fElem = (longdouble *)operator_new__(-(ulong)(uVar13 >> 0x3c != 0) | uVar13 * 0x10)
        ;
      }
      local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_150.fElem = (longdouble *)0x0;
      local_150.fGiven = (longdouble *)0x0;
      local_150.fSize = 0;
      local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0181e1d8;
      local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = (long)iVar20;
      local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = (long)iVar12;
      TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
      local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
      local_150.fPivot.super_TPZVec<int>.fNElements = 0;
      local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
      local_150.fWork.fStore = (longdouble *)0x0;
      local_150.fWork.fNElements = 0;
      local_150.fWork.fNAlloc = 0;
      if (uVar17 != 0) {
        local_150.fElem =
             (longdouble *)operator_new__(-(ulong)(uVar17 >> 0x3c != 0) | uVar17 * 0x10);
      }
      if (0 < iVar20) {
        uVar19 = 0;
        do {
          if (0 < iVar12) {
            uVar15 = 0;
            lVar21 = in_ST0;
            lVar4 = in_ST1;
            lVar5 = in_ST2;
            lVar6 = in_ST3;
            lVar7 = in_ST4;
            lVar8 = in_ST5;
            lVar9 = in_ST6;
            in_ST6 = in_ST7;
            do {
              in_ST5 = lVar9;
              in_ST4 = lVar8;
              in_ST3 = lVar7;
              in_ST2 = lVar6;
              in_ST1 = lVar5;
              in_ST0 = lVar4;
              (*(fine->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])
                        (fine,(long)(*(int *)&(this->super_TPZMatrix<long_double>).
                                              super_TPZBaseMatrix.field_0x1c * (int)uVar19 + iVar18)
                         ,uVar15);
              if ((local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow <= (long)uVar19)
                 || (local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol <= (long)uVar15
                    )) {
                TPZFMatrix<long_double>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_150.fElem
              [local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow * uVar15 + uVar19] =
                   lVar21;
              uVar15 = uVar15 + 1;
              lVar21 = in_ST0;
              lVar4 = in_ST1;
              lVar5 = in_ST2;
              lVar6 = in_ST3;
              lVar7 = in_ST4;
              lVar8 = in_ST5;
              lVar9 = in_ST6;
              in_ST7 = in_ST6;
            } while (uVar14 != uVar15);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != (uVar2 & 0x7fffffff));
      }
      MultiplyScalar(this,&local_150,&local_c0,1);
      if (0 < iVar16) {
        uVar19 = 0;
        do {
          if (0 < iVar12) {
            uVar15 = 0;
            do {
              if ((local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow <= (long)uVar19)
                 || (local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol <= (long)uVar15)
                 ) {
                TPZFMatrix<long_double>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              iVar11 = *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c
                       * (int)uVar19 + iVar18;
              if (((iVar11 < 0) ||
                  (lVar3 = (coarse->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow,
                  lVar3 <= iVar11)) ||
                 ((coarse->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= (long)uVar15))
              {
                TPZFMatrix<long_double>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              coarse->fElem[lVar3 * uVar15 + (long)iVar11] =
                   local_c0.fElem
                   [local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow * uVar15 + uVar19
                   ];
              uVar15 = uVar15 + 1;
              in_ST7 = in_ST6;
            } while (uVar14 != uVar15);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != (uVar1 & 0x7fffffff));
      }
      TPZFMatrix<long_double>::~TPZFMatrix(&local_150);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
      iVar18 = iVar18 + 1;
    } while (iVar18 < *(int *)&(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.field_0x1c);
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::TransferResidual(const TPZFMatrix<TVar> &fine, TPZFMatrix<TVar> &coarse){
	int iv;
	int nrf = fine.Rows();
	int ncf = fine.Cols();
	int nrc = coarse.Rows();
	int ncc = coarse.Cols();
    int thisr = this->Rows();
    int thisc = this->Cols();
	if(ncc != ncf || nrc != this->Cols()*fNTVarVar) {
		ncc = ncf;
		nrc = this->Cols()*fNTVarVar;
		coarse.Redim(nrc,ncf);
	}
    if (fNTVarVar == 1) {
        MultiplyScalar(fine,coarse,1);
    }
    else
    {
        for(iv=0; iv<fNTVarVar; iv++) {
            TPZFMatrix<TVar> tempcoarse(thisr,ncc), tempfine(thisc,ncf);
            for (int i=0; i<thisc; i++) {
                for (int c=0; c<ncf; c++) {
                    tempfine(i,c) = fine.GetVal(iv+i*fNTVarVar,c);
                    
                }
            }
            MultiplyScalar(tempfine, tempcoarse, 1);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncf; c++) {
                    coarse(iv+i*fNTVarVar,c) = tempcoarse(i,c);
                    
                }
            }
        }
    }

}